

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

char * owner_parse(char *spec,int *uid,int *gid)

{
  int *piVar1;
  ulong uVar2;
  __gid_t *in_RDX;
  __uid_t *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *end_1;
  group *grp;
  char *end;
  passwd *pwent;
  char *user;
  char *g;
  char *ue;
  char *u;
  char *local_60;
  group *local_58;
  char *local_50;
  passwd *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  __gid_t *local_20;
  __uid_t *local_18;
  char *local_8;
  
  *in_RSI = 0xffffffff;
  *in_RDX = 0xffffffff;
  if (*in_RDI == '\0') {
    local_8 = "Invalid empty user/group spec";
  }
  else {
    if ((*in_RDI == ':') || (local_30 = in_RDI, *in_RDI == '.')) {
      local_28 = (char *)0x0;
      local_30 = (char *)0x0;
      local_38 = in_RDI + 1;
    }
    else {
      while( true ) {
        bVar3 = false;
        if ((*local_30 != ':') && (bVar3 = false, *local_30 != '.')) {
          bVar3 = *local_30 != '\0';
        }
        if (!bVar3) break;
        local_30 = local_30 + 1;
      }
      local_38 = local_30;
      local_28 = in_RDI;
      if (*local_30 != '\0') {
        local_38 = local_30 + 1;
      }
    }
    local_20 = in_RDX;
    if (local_28 != (char *)0x0) {
      local_18 = in_RSI;
      local_40 = (char *)malloc((size_t)(local_30 + (1 - (long)local_28)));
      if (local_40 == (char *)0x0) {
        local_8 = "Couldn\'t allocate memory";
        return local_8;
      }
      memcpy(local_40,local_28,(long)local_30 - (long)local_28);
      local_40[(long)local_30 - (long)local_28] = '\0';
      local_48 = getpwnam(local_40);
      if (local_48 == (passwd *)0x0) {
        piVar1 = __errno_location();
        *piVar1 = 0;
        uVar2 = strtoul(local_40,&local_50,10);
        *local_18 = (__uid_t)uVar2;
        piVar1 = __errno_location();
        if ((*piVar1 != 0) || (*local_50 != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup user ``%s\'\'",local_40);
          owner_parse::errbuff[0x7f] = '\0';
          free(local_40);
          local_8 = owner_parse::errbuff;
          return local_8;
        }
      }
      else {
        *local_18 = local_48->pw_uid;
        if (*local_30 != '\0') {
          *local_20 = local_48->pw_gid;
        }
      }
      free(local_40);
    }
    if (*local_38 != '\0') {
      local_58 = getgrnam(local_38);
      if (local_58 == (group *)0x0) {
        piVar1 = __errno_location();
        *piVar1 = 0;
        uVar2 = strtoul(local_38,&local_60,10);
        *local_20 = (__gid_t)uVar2;
        piVar1 = __errno_location();
        if ((*piVar1 != 0) || (*local_60 != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup group ``%s\'\'",local_38);
          local_8 = owner_parse::errbuff;
          owner_parse::errbuff[0x7f] = '\0';
          return local_8;
        }
      }
      else {
        *local_20 = local_58->gr_gid;
      }
    }
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *
owner_parse(const char *spec, int *uid, int *gid)
{
	static char errbuff[128];
	const char *u, *ue, *g;

	*uid = -1;
	*gid = -1;

	if (spec[0] == '\0')
		return ("Invalid empty user/group spec");

	/*
	 * Split spec into [user][:.][group]
	 *  u -> first char of username, NULL if no username
	 *  ue -> first char after username (colon, period, or \0)
	 *  g -> first char of group name
	 */
	if (*spec == ':' || *spec == '.') {
		/* If spec starts with ':' or '.', then just group. */
		ue = u = NULL;
		g = spec + 1;
	} else {
		/* Otherwise, [user] or [user][:] or [user][:][group] */
		ue = u = spec;
		while (*ue != ':' && *ue != '.' && *ue != '\0')
			++ue;
		g = ue;
		if (*g != '\0') /* Skip : or . to find first char of group. */
			++g;
	}

	if (u != NULL) {
		/* Look up user: ue is first char after end of user. */
		char *user;
		struct passwd *pwent;

		user = (char *)malloc(ue - u + 1);
		if (user == NULL)
			return ("Couldn't allocate memory");
		memcpy(user, u, ue - u);
		user[ue - u] = '\0';
		if ((pwent = getpwnam(user)) != NULL) {
			*uid = pwent->pw_uid;
			if (*ue != '\0')
				*gid = pwent->pw_gid;
		} else {
			char *end;
			errno = 0;
			*uid = (int)strtoul(user, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup user ``%s''", user);
				errbuff[sizeof(errbuff) - 1] = '\0';
				free(user);
				return (errbuff);
			}
		}
		free(user);
	}

	if (*g != '\0') {
		struct group *grp;
		if ((grp = getgrnam(g)) != NULL) {
			*gid = grp->gr_gid;
		} else {
			char *end;
			errno = 0;
			*gid = (int)strtoul(g, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup group ``%s''", g);
				errbuff[sizeof(errbuff) - 1] = '\0';
				return (errbuff);
			}
		}
	}
	return (NULL);
}